

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O3

void __thiscall
Clone_modelWithVariableEquivalences_Test::TestBody(Clone_modelWithVariableEquivalences_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  ModelPtr m;
  ComponentPtr c;
  UnitsPtr u;
  VariablePtr v2;
  VariablePtr v1;
  ComponentPtr c2;
  ComponentPtr c1;
  AssertionResult gtest_ar;
  ModelPtr mClone;
  PrinterPtr p;
  long *local_f0 [2];
  long local_e0 [2];
  string *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  string *local_c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b8;
  string *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a8;
  shared_ptr *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  shared_ptr *local_90;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  string *local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  string *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [16];
  shared_ptr local_30 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  bool local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  psVar1 = local_d0;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"unique_model","");
  libcellml::Entity::setId(psVar1);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  psVar1 = local_d0;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"model","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Component::create();
  libcellml::Variable::create();
  libcellml::Variable::create();
  libcellml::Units::create();
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"second","");
  libcellml::NamedEntity::setName(local_b0);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  libcellml::Variable::setUnits(local_90);
  libcellml::Variable::setUnits(local_a0);
  libcellml::Model::addUnits((shared_ptr *)local_d0);
  psVar1 = local_c0;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"unique","");
  libcellml::Entity::setId(psVar1);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  psVar1 = local_c0;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"copy","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  psVar1 = local_70;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"child_1","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  libcellml::Component::addVariable((shared_ptr *)local_70);
  psVar1 = local_80;
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"child_2","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  libcellml::Component::addVariable((shared_ptr *)local_80);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_c0);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_c0);
  libcellml::ComponentEntity::addComponent((shared_ptr *)local_d0);
  libcellml::Variable::addEquivalence((shared_ptr *)&local_90,(shared_ptr *)&local_a0);
  libcellml::Model::clone();
  compareModel((shared_ptr *)&local_d0,local_30);
  libcellml::Printer::create();
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)local_f0,local_20);
  libcellml::Printer::printModel_abi_cxx11_((shared_ptr *)&local_60,local_20);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_40,(internal *)"p->printModel(m)","p->printModel(mClone)",
             (char *)local_f0,&local_60,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0],local_e0[0] + 1);
  }
  if (local_40[0] == false) {
    testing::Message::Message((Message *)local_f0);
    if ((undefined8 *)local_40._8_8_ == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_40._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x1e4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
    if (local_f0[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_f0[0] != (long *)0x0)) {
        (**(code **)(*local_f0[0] + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_40 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if (local_b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8);
  }
  if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
  }
  return;
}

Assistant:

TEST(Clone, modelWithVariableEquivalences)
{
    auto m = libcellml::Model::create();
    m->setId("unique_model");
    m->setName("model");

    auto c = libcellml::Component::create();
    auto c1 = libcellml::Component::create();
    auto c2 = libcellml::Component::create();
    auto v1 = libcellml::Variable::create();
    auto v2 = libcellml::Variable::create();
    auto u = libcellml::Units::create();

    u->setName("second");

    v1->setUnits(u);
    v2->setUnits(u);
    m->addUnits(u);

    c->setId("unique");
    c->setName("copy");
    c1->setName("child_1");
    c1->addVariable(v1);
    c2->setName("child_2");
    c2->addVariable(v2);

    c->addComponent(c1);
    c->addComponent(c2);

    m->addComponent(c);

    libcellml::Variable::addEquivalence(v1, v2);

    auto mClone = m->clone();

    compareModel(m, mClone);

    libcellml::PrinterPtr p = libcellml::Printer::create();

    EXPECT_EQ(p->printModel(m), p->printModel(mClone));
}